

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

gc_heap_ptr_untyped * __thiscall
mjs::gc_heap_ptr_untyped::operator=(gc_heap_ptr_untyped *this,gc_heap_ptr_untyped *p)

{
  gc_heap *this_00;
  
  if (this != p) {
    if (this->heap_ != (gc_heap *)0x0) {
      gc_heap::detach(this->heap_,this);
    }
    this_00 = p->heap_;
    this->heap_ = this_00;
    this->pos_ = p->pos_;
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,this);
    }
  }
  return this;
}

Assistant:

gc_heap_ptr_untyped& operator=(const gc_heap_ptr_untyped& p) {
        if (this != &p) {
            if (heap_) {
                heap_->detach(*this);
            }
            heap_ = p.heap_;
            pos_ = p.pos_;
            if (heap_) {
                heap_->attach(*this);
            }
        }
        return *this;
    }